

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# document.h
# Opt level: O3

ValueIterator __thiscall
rapidjson::
GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::End
          (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
           *this)

{
  RapidJSONException *this_00;
  
  if ((this->data_).f.flags == 4) {
    return (ValueIterator)
           ((ulong)(this->data_).s.length * 0x10 + ((ulong)(this->data_).s.str & 0xffffffffffff));
  }
  this_00 = (RapidJSONException *)__cxa_allocate_exception(0x10);
  cereal::RapidJSONException::RapidJSONException
            (this_00,"rapidjson internal assertion failure: IsArray()");
  __cxa_throw(this_00,&cereal::RapidJSONException::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

bool IsArray()  const { return data_.f.flags == kArrayFlag; }